

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.c
# Opt level: O0

void * hash_table_get(HashTable *hash_table,char *key)

{
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  HashTableEntry *last;
  HashTableEntry *next;
  unsigned_long hash_literal;
  char *key_local;
  HashTable *hash_table_local;
  
  uVar3 = hash(hash_table->size,key);
  last = hash_table->table[uVar3];
  if (last != (HashTableEntry *)0x0) {
    while( true ) {
      bVar1 = false;
      if (last != (HashTableEntry *)0x0) {
        iVar2 = strcmp(key,last->key);
        bVar1 = 0 < iVar2;
      }
      if (!bVar1) break;
      last = last->next;
    }
    if ((last != (HashTableEntry *)0x0) && (iVar2 = strcmp(key,last->key), iVar2 == 0)) {
      return last->literal;
    }
  }
  return (void *)0x0;
}

Assistant:

void *hash_table_get(HashTable *hash_table, char *key) {
  unsigned long int hash_literal = hash(hash_table->size, key);

  HashTableEntry *next = hash_table->table[hash_literal];

  if (next != NULL) {
    HashTableEntry *last;

    while (next != NULL && strcmp(key, next->key) > 0) {
      last = next;
      next = last->next;
    }

    if (next != NULL && strcmp(key, next->key) == 0) {
      return next->literal;
    }
  }

  return NULL;
}